

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O1

ngx_int_t ngx_http_do_read_client_request_body(ngx_http_request_t *r)

{
  u_char **ppuVar1;
  ngx_connection_t *pnVar2;
  ngx_http_request_body_t *pnVar3;
  ngx_buf_t *pnVar4;
  ngx_event_t *pnVar5;
  ngx_int_t nVar6;
  u_char *puVar7;
  ngx_int_t nVar8;
  u_char *puVar9;
  ngx_chain_t *in;
  u_char *puVar10;
  undefined1 local_40 [8];
  ngx_chain_t out;
  
  pnVar2 = r->connection;
  pnVar3 = r->request_body;
  if ((pnVar2->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar2->log,0,"http read client request body");
  }
  do {
    pnVar4 = pnVar3->buf;
    if (pnVar4->last == pnVar4->end) {
      if (pnVar4->pos == pnVar4->last) {
        in = (ngx_chain_t *)0x0;
      }
      else {
        out.buf = (ngx_buf_t *)0x0;
        in = (ngx_chain_t *)local_40;
        local_40 = (undefined1  [8])pnVar4;
      }
      nVar6 = ngx_http_request_body_filter(r,in);
      if (nVar6 != 0) {
        return nVar6;
      }
      if (pnVar3->busy != (ngx_chain_t *)0x0) {
        if ((r->field_0x467 & 4) == 0) {
          return 500;
        }
        pnVar5 = pnVar2->read;
        if ((pnVar5->field_0x9 & 8) != 0) {
          if ((pnVar5->log->log_level & 0x80) != 0) {
            ngx_log_error_core(8,pnVar5->log,0,"event timer del: %d: %M",
                               (ulong)*(uint *)((long)pnVar5->data + 0x18),(pnVar5->timer).key);
          }
          ngx_rbtree_delete(&ngx_event_timer_rbtree,&pnVar5->timer);
          (pnVar5->timer).left = (ngx_rbtree_node_t *)0x0;
          (pnVar5->timer).right = (ngx_rbtree_node_t *)0x0;
          (pnVar5->timer).parent = (ngx_rbtree_node_t *)0x0;
          pnVar5->field_0x9 = pnVar5->field_0x9 & 0xf7;
        }
        goto LAB_00148b78;
      }
      pnVar4 = pnVar3->buf;
      pnVar4->pos = pnVar4->start;
      pnVar4->last = pnVar4->start;
    }
    pnVar4 = pnVar3->buf;
    puVar7 = pnVar4->last;
    puVar10 = pnVar4->pos + (pnVar3->rest - (long)puVar7);
    puVar9 = pnVar4->end + -(long)puVar7;
    if ((long)puVar10 <= (long)(pnVar4->end + -(long)puVar7)) {
      puVar9 = puVar10;
    }
    puVar7 = (u_char *)(*pnVar2->recv)(pnVar2,puVar7,(size_t)puVar9);
    if ((pnVar2->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar2->log,0,"http client request body recv %z",puVar7);
    }
    if (puVar7 == (u_char *)0xfffffffffffffffe) goto LAB_00148ae3;
    if ((puVar7 == (u_char *)0x0) && (6 < pnVar2->log->log_level)) {
      ngx_log_error_core(7,pnVar2->log,0,"client prematurely closed connection");
    }
    if (puVar7 + 1 < (u_char *)0x2) {
      pnVar2->field_0xd9 = pnVar2->field_0xd9 | 0x10;
      return 400;
    }
    pnVar4 = pnVar3->buf;
    ppuVar1 = &pnVar4->last;
    *ppuVar1 = *ppuVar1 + (long)puVar7;
    r->request_length = (off_t)(puVar7 + r->request_length);
    if (puVar7 == puVar10) {
      out.buf = (ngx_buf_t *)0x0;
      local_40 = (undefined1  [8])pnVar4;
      nVar6 = ngx_http_request_body_filter(r,(ngx_chain_t *)local_40);
      if (nVar6 != 0) {
        return nVar6;
      }
    }
    if ((pnVar3->rest == 0) || (pnVar3->buf->last < pnVar3->buf->end)) {
LAB_00148ae3:
      if ((pnVar2->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2->log,0,"http client request body rest %O",pnVar3->rest);
      }
      if (pnVar3->rest == 0) {
        if ((pnVar2->read->field_0x9 & 8) != 0) {
          ngx_event_del_timer(pnVar2->read);
        }
        if ((r->field_0x467 & 4) == 0) {
          r->read_event_handler = ngx_http_block_reading;
          (*pnVar3->post_handler)(r);
        }
        return 0;
      }
      if ((pnVar2->read->field_0x8 & 0x20) == 0) {
        if (((r->field_0x467 & 4) != 0) && (pnVar4 = pnVar3->buf, pnVar4->pos != pnVar4->last)) {
          out.buf = (ngx_buf_t *)0x0;
          local_40 = (undefined1  [8])pnVar4;
          nVar6 = ngx_http_request_body_filter(r,(ngx_chain_t *)local_40);
          if (nVar6 != 0) {
            return nVar6;
          }
        }
        ngx_event_add_timer(pnVar2->read,
                            *(ngx_msec_t *)
                             ((long)r->loc_conf[ngx_http_core_module.ctx_index] + 0x100));
LAB_00148b78:
        nVar6 = ngx_handle_read_event(pnVar2->read,0);
        nVar8 = 500;
        if (nVar6 == 0) {
          nVar8 = -2;
        }
        return nVar8;
      }
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_do_read_client_request_body(ngx_http_request_t *r)
{
    off_t                      rest;
    size_t                     size;
    ssize_t                    n;
    ngx_int_t                  rc;
    ngx_chain_t                out;
    ngx_connection_t          *c;
    ngx_http_request_body_t   *rb;
    ngx_http_core_loc_conf_t  *clcf;

    c = r->connection;
    rb = r->request_body;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http read client request body");

    for ( ;; ) {
        for ( ;; ) {
            if (rb->buf->last == rb->buf->end) {

                if (rb->buf->pos != rb->buf->last) {

                    /* pass buffer to request body filter chain */

                    out.buf = rb->buf;
                    out.next = NULL;

                    rc = ngx_http_request_body_filter(r, &out);

                    if (rc != NGX_OK) {
                        return rc;
                    }

                } else {

                    /* update chains */

                    rc = ngx_http_request_body_filter(r, NULL);

                    if (rc != NGX_OK) {
                        return rc;
                    }
                }

                if (rb->busy != NULL) {
                    if (r->request_body_no_buffering) {
                        if (c->read->timer_set) {
                            ngx_del_timer(c->read);
                        }

                        if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                            return NGX_HTTP_INTERNAL_SERVER_ERROR;
                        }

                        return NGX_AGAIN;
                    }

                    return NGX_HTTP_INTERNAL_SERVER_ERROR;
                }

                rb->buf->pos = rb->buf->start;
                rb->buf->last = rb->buf->start;
            }

            size = rb->buf->end - rb->buf->last;
            rest = rb->rest - (rb->buf->last - rb->buf->pos);

            if ((off_t) size > rest) {
                size = (size_t) rest;
            }

            n = c->recv(c, rb->buf->last, size);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                           "http client request body recv %z", n);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == 0) {
                ngx_log_error(NGX_LOG_INFO, c->log, 0,
                              "client prematurely closed connection");
            }

            if (n == 0 || n == NGX_ERROR) {
                c->error = 1;
                return NGX_HTTP_BAD_REQUEST;
            }

            rb->buf->last += n;
            r->request_length += n;

            if (n == rest) {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            if (rb->rest == 0) {
                break;
            }

            if (rb->buf->last < rb->buf->end) {
                break;
            }
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                       "http client request body rest %O", rb->rest);

        if (rb->rest == 0) {
            break;
        }

        if (!c->read->ready) {

            if (r->request_body_no_buffering
                && rb->buf->pos != rb->buf->last)
            {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);
            ngx_add_timer(c->read, clcf->client_body_timeout);

            if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            return NGX_AGAIN;
        }
    }

    if (c->read->timer_set) {
        ngx_del_timer(c->read);
    }

    if (!r->request_body_no_buffering) {
        r->read_event_handler = ngx_http_block_reading;
        rb->post_handler(r);
    }

    return NGX_OK;
}